

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O0

void __thiscall
spdlog::details::registry::register_logger_(registry *this,shared_ptr<spdlog::logger> *new_logger)

{
  element_type *this_00;
  string *psVar1;
  mapped_type *__r;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
  *in_RSI;
  string *in_stack_00000008;
  registry *in_stack_00000010;
  string logger_name;
  key_type *in_stack_ffffffffffffff98;
  string local_30 [48];
  
  this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x18775f);
  psVar1 = logger::name_abi_cxx11_(this_00);
  std::__cxx11::string::string(local_30,(string *)psVar1);
  throw_if_exists_(in_stack_00000010,in_stack_00000008);
  __r = std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<spdlog::logger>_>_>_>
        ::operator[](in_RSI,in_stack_ffffffffffffff98);
  std::shared_ptr<spdlog::logger>::operator=((shared_ptr<spdlog::logger> *)in_RSI,__r);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

SPDLOG_INLINE void registry::register_logger_(std::shared_ptr<logger> new_logger)
{
    auto logger_name = new_logger->name();
    throw_if_exists_(logger_name);
    loggers_[logger_name] = std::move(new_logger);
}